

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O0

void __thiscall HuffmanEncoder::run(HuffmanEncoder *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  size_type __val;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  size_type sVar5;
  reference pvVar6;
  HuffmanNode *pHVar7;
  mapped_type *pmVar8;
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_01;
  string local_2f8;
  reference local_2d8;
  char *c_1;
  iterator __end1_2;
  iterator __begin1_2;
  string *__range1_2;
  shared_ptr<HuffmanNode> parent;
  value_type right_son;
  value_type left_son;
  undefined1 local_260 [8];
  shared_ptr<HuffmanNode> node;
  bitset<8UL> local_248;
  reference local_240;
  pair<const_char,_int> *symbol;
  iterator __end1_1;
  iterator __begin1_1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *__range1_1;
  stringstream local_218 [8];
  stringstream output;
  basic_ostream<char,_std::char_traits<char>_> local_208 [376];
  reference local_90;
  char *c;
  iterator __end1;
  iterator __begin1;
  string local_68;
  string *local_48;
  string *__range1;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> symbols;
  HuffmanEncoder *this_local;
  
  symbols._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Huffman encryption...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
            ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
             &__range1);
  Cryptor::get_in_message_abi_cxx11_(&local_68,&this->super_Cryptor);
  local_48 = &local_68;
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&c), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    pmVar3 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                         *)&__range1,local_90);
    *pmVar3 = *pmVar3 + 1;
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::stringstream::stringstream(local_218);
  __val = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::size
                    ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                      *)&__range1);
  std::bitset<8UL>::bitset((bitset<8UL> *)&__range1_1,__val);
  pbVar4 = std::operator<<(local_208,(bitset<8UL> *)&__range1_1);
  std::ostream::operator<<(pbVar4,std::flush<char,std::char_traits<char>>);
  __end1_1 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             begin((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
                   &__range1);
  symbol = (pair<const_char,_int> *)
           std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::end
                     ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                       *)&__range1);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&symbol), bVar1) {
    local_240 = std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator*(&__end1_1);
    std::bitset<8UL>::bitset(&local_248,(long)local_240->first);
    pbVar4 = std::operator<<(local_208,&local_248);
    this_00 = &node.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::bitset<8UL>::bitset((bitset<8UL> *)this_00,(long)local_240->second);
    pbVar4 = std::operator<<(pbVar4,(bitset<8UL> *)this_00);
    std::ostream::operator<<(pbVar4,std::flush<char,std::char_traits<char>>);
    pHVar7 = (HuffmanNode *)operator_new(0x28);
    HuffmanNode::HuffmanNode(pHVar7,local_240->first,local_240->second);
    std::shared_ptr<HuffmanNode>::shared_ptr<HuffmanNode,void>
              ((shared_ptr<HuffmanNode> *)local_260,pHVar7);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(&this->nodes_,(value_type *)local_260);
    std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)local_260);
    std::_Rb_tree_iterator<std::pair<const_char,_int>_>::operator++(&__end1_1);
  }
  while (sVar5 = std::__cxx11::
                 list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                 ::size(&this->nodes_), 1 < sVar5) {
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::sort<HuffmanComparator>(&this->nodes_);
    this_01 = &this->nodes_;
    pvVar6 = std::__cxx11::
             list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
             front(this_01);
    std::shared_ptr<HuffmanNode>::shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pvVar6);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_01);
    pvVar6 = std::__cxx11::
             list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::
             front(this_01);
    std::shared_ptr<HuffmanNode>::shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pvVar6);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_01);
    pHVar7 = (HuffmanNode *)operator_new(0x28);
    HuffmanNode::HuffmanNode
              (pHVar7,(shared_ptr<HuffmanNode> *)
                      &right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
               (shared_ptr<HuffmanNode> *)
               &parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<HuffmanNode>::shared_ptr<HuffmanNode,void>
              ((shared_ptr<HuffmanNode> *)&__range1_2,pHVar7);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(&this->nodes_,(value_type *)&__range1_2);
    std::shared_ptr<HuffmanNode>::~shared_ptr((shared_ptr<HuffmanNode> *)&__range1_2);
    std::shared_ptr<HuffmanNode>::~shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<HuffmanNode>::~shared_ptr
              ((shared_ptr<HuffmanNode> *)
               &right_son.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  pvVar6 = std::__cxx11::
           list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>::front
                     (&this->nodes_);
  build(this,pvVar6);
  Cryptor::get_in_message_abi_cxx11_((string *)&__begin1_2,&this->super_Cryptor);
  __end1_2._M_current = (char *)std::__cxx11::string::begin();
  c_1 = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&c_1), bVar1) {
    local_2d8 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end1_2);
    pmVar8 = std::
             map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->table_,local_2d8);
    poVar2 = std::operator<<(local_208,(string *)pmVar8);
    std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_2);
  }
  std::__cxx11::string::~string((string *)&__begin1_2);
  std::__cxx11::stringstream::str();
  Cryptor::set_out_message(&this->super_Cryptor,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  poVar2 = std::operator<<((ostream *)&std::cout,"encryption done!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_218);
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
            ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)
             &__range1);
  return;
}

Assistant:

void HuffmanEncoder::run() {
  cout << "Huffman encryption..." << endl;

  //find number of occurrence of each symbol
  map<char, int> symbols;
  for (auto& c : get_in_message()) {
    symbols[c]++;
  }

  //initial list of leaves & saving to output
  stringstream output;
  output << bitset<8>(symbols.size()) << flush;
  for (auto& symbol : symbols) {
    output << bitset<8>(static_cast<unsigned long long int>(symbol.first))
      << bitset<8>(static_cast<unsigned long long int>(symbol.second)) << flush;
    shared_ptr<HuffmanNode> node(new HuffmanNode(symbol.first, symbol.second));
    nodes_.push_back(node);
  }

  //building the tree
  while (nodes_.size() > 1) {
    nodes_.sort(HuffmanComparator());

    auto left_son = nodes_.front();
    nodes_.pop_front();
    auto right_son = nodes_.front();
    nodes_.pop_front();

    shared_ptr<HuffmanNode> parent(new HuffmanNode(left_son, right_son));
    nodes_.push_back(parent);
  }

  //building code table
  build(nodes_.front());

  //saving encoded message
  for (auto& c : get_in_message()) {
    output << table_[c] << flush;
  }
  set_out_message(output.str());

  cout << "encryption done!" << endl;
}